

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.cpp
# Opt level: O1

ElementsDecodeRawTransactionTxOutStruct * __thiscall
cfd::api::json::ElementsDecodeRawTransactionTxOut::ConvertToStruct
          (ElementsDecodeRawTransactionTxOutStruct *__return_storage_ptr__,
          ElementsDecodeRawTransactionTxOut *this)

{
  int64_t iVar1;
  int iVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_198;
  undefined1 local_180 [64];
  int local_140;
  string local_138 [32];
  pointer local_118;
  pointer pbStack_110;
  pointer local_108;
  string local_100 [32];
  string local_e0 [32];
  string local_c0 [32];
  int local_a0;
  string asStack_98 [32];
  pointer local_78;
  pointer pbStack_70;
  pointer local_68;
  _Rb_tree_node_base local_58;
  size_t local_38;
  
  ElementsDecodeRawTransactionTxOutStruct::ElementsDecodeRawTransactionTxOutStruct
            (__return_storage_ptr__);
  iVar1 = this->value_minimum_;
  __return_storage_ptr__->value = this->value_;
  __return_storage_ptr__->value_minimum = iVar1;
  __return_storage_ptr__->value_maximum = this->value_maximum_;
  iVar2 = this->ct_bits_;
  __return_storage_ptr__->ct_exponent = this->ct_exponent_;
  __return_storage_ptr__->ct_bits = iVar2;
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->surjectionproof);
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->valuecommitment);
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->asset);
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->assetcommitment);
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->commitmentnonce);
  __return_storage_ptr__->commitmentnonce_fully_valid = this->commitmentnonce_fully_valid_;
  __return_storage_ptr__->n = this->n_;
  ElementsDecodeLockingScript::ConvertToStruct
            ((ElementsDecodeLockingScriptStruct *)local_180,&this->script_pub_key_);
  std::__cxx11::string::operator=
            ((string *)&__return_storage_ptr__->script_pub_key,(string *)local_180);
  std::__cxx11::string::operator=
            ((string *)&(__return_storage_ptr__->script_pub_key).hex,(string *)(local_180 + 0x20));
  (__return_storage_ptr__->script_pub_key).req_sigs = local_140;
  std::__cxx11::string::operator=
            ((string *)&(__return_storage_ptr__->script_pub_key).type,local_138);
  local_198.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (__return_storage_ptr__->script_pub_key).addresses.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_198.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (__return_storage_ptr__->script_pub_key).addresses.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_198.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (__return_storage_ptr__->script_pub_key).addresses.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (__return_storage_ptr__->script_pub_key).addresses.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = local_118;
  (__return_storage_ptr__->script_pub_key).addresses.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pbStack_110;
  (__return_storage_ptr__->script_pub_key).addresses.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = local_108;
  local_118 = (pointer)0x0;
  pbStack_110 = (pointer)0x0;
  local_108 = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_198);
  std::__cxx11::string::operator=
            ((string *)&(__return_storage_ptr__->script_pub_key).pegout_chain,local_100);
  std::__cxx11::string::operator=
            ((string *)&(__return_storage_ptr__->script_pub_key).pegout_asm,local_e0);
  std::__cxx11::string::operator=
            ((string *)&(__return_storage_ptr__->script_pub_key).pegout_hex,local_c0);
  (__return_storage_ptr__->script_pub_key).pegout_req_sigs = local_a0;
  std::__cxx11::string::operator=
            ((string *)&(__return_storage_ptr__->script_pub_key).pegout_type,asStack_98);
  local_198.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (__return_storage_ptr__->script_pub_key).pegout_addresses.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_198.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (__return_storage_ptr__->script_pub_key).pegout_addresses.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_198.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (__return_storage_ptr__->script_pub_key).pegout_addresses.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (__return_storage_ptr__->script_pub_key).pegout_addresses.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = local_78;
  (__return_storage_ptr__->script_pub_key).pegout_addresses.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pbStack_70;
  (__return_storage_ptr__->script_pub_key).pegout_addresses.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = local_68;
  local_78 = (pointer)0x0;
  pbStack_70 = (pointer)0x0;
  local_68 = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_198);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&(__return_storage_ptr__->script_pub_key).ignore_items._M_t);
  if (local_58._M_parent != (_Base_ptr)0x0) {
    (__return_storage_ptr__->script_pub_key).ignore_items._M_t._M_impl.super__Rb_tree_header.
    _M_header._M_color = local_58._M_color;
    (__return_storage_ptr__->script_pub_key).ignore_items._M_t._M_impl.super__Rb_tree_header.
    _M_header._M_parent = local_58._M_parent;
    (__return_storage_ptr__->script_pub_key).ignore_items._M_t._M_impl.super__Rb_tree_header.
    _M_header._M_left = local_58._M_left;
    (__return_storage_ptr__->script_pub_key).ignore_items._M_t._M_impl.super__Rb_tree_header.
    _M_header._M_right = local_58._M_right;
    (local_58._M_parent)->_M_parent =
         &(__return_storage_ptr__->script_pub_key).ignore_items._M_t._M_impl.super__Rb_tree_header.
          _M_header;
    (__return_storage_ptr__->script_pub_key).ignore_items._M_t._M_impl.super__Rb_tree_header.
    _M_node_count = local_38;
    local_58._M_parent = (_Base_ptr)0x0;
    local_38 = 0;
    local_58._M_left = &local_58;
    local_58._M_right = &local_58;
  }
  ElementsDecodeLockingScriptStruct::~ElementsDecodeLockingScriptStruct
            ((ElementsDecodeLockingScriptStruct *)local_180);
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->rangeproof);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(__return_storage_ptr__->ignore_items)._M_t,&(this->ignore_items)._M_t);
  return __return_storage_ptr__;
}

Assistant:

ElementsDecodeRawTransactionTxOutStruct ElementsDecodeRawTransactionTxOut::ConvertToStruct() const {  // NOLINT
  ElementsDecodeRawTransactionTxOutStruct result;
  result.value = value_;
  result.value_minimum = value_minimum_;
  result.value_maximum = value_maximum_;
  result.ct_exponent = ct_exponent_;
  result.ct_bits = ct_bits_;
  result.surjectionproof = surjectionproof_;
  result.valuecommitment = valuecommitment_;
  result.asset = asset_;
  result.assetcommitment = assetcommitment_;
  result.commitmentnonce = commitmentnonce_;
  result.commitmentnonce_fully_valid = commitmentnonce_fully_valid_;
  result.n = n_;
  result.script_pub_key = script_pub_key_.ConvertToStruct();
  result.rangeproof = rangeproof_;
  result.ignore_items = ignore_items;
  return result;
}